

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::setDisplayFormat(QDateTimeEdit *this,QString *format)

{
  QDate min;
  bool bVar1;
  Int IVar2;
  QDateTimeEditPrivate *pQVar3;
  ulong uVar4;
  iterator iVar5;
  qsizetype qVar6;
  Promoted<int,_long_long> PVar7;
  QDateTimeEdit *this_00;
  QDateTimeEdit *this_01;
  QString *in_RSI;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  byte bVar8;
  undefined1 uVar9;
  bool dateShown;
  bool timeShown;
  int i;
  QDateTimeEditPrivate *d;
  QTime time;
  QString *in_stack_fffffffffffffef8;
  QTime *rhs;
  QDateTimeParser *this_02;
  iterator in_stack_ffffffffffffff10;
  iterator in_stack_ffffffffffffff18;
  undefined6 in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  QTime time_00;
  iterator in_stack_ffffffffffffff40;
  QTime in_stack_ffffffffffffff48;
  QTime in_stack_ffffffffffffff4c;
  QDateTime local_90 [8];
  QTime local_88;
  QTime local_84;
  undefined4 local_80;
  QTime local_7c;
  QTime local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  QFlagsStorageHelper<QDateTimeEdit::Section,_4> local_68;
  QFlagsStorageHelper<QDateTimeEdit::Section,_4> local_64;
  long local_60;
  undefined4 local_58;
  QFlagsStorageHelper<QDateTimeEdit::Section,_4> local_54;
  QVariant local_28;
  long local_8;
  
  time_00.mds = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QDateTimeEdit *)0x55a8d5);
  this_02 = &pQVar3->super_QDateTimeParser;
  QStringView::QStringView<QString,_true>
            ((QStringView *)in_stack_ffffffffffffff10.i,(QString *)this_02);
  uVar4 = QDateTimeParser::parseFormat((QStringView *)this_02);
  if ((uVar4 & 1) != 0) {
    QString::clear((QString *)in_RDI);
    bVar1 = QWidget::isRightToLeft((QWidget *)0x55a93a);
    if (bVar1) {
      QString::operator=(&pQVar3->unreversedFormat,in_RSI);
      QString::clear((QString *)in_RDI);
      qVar6 = QList<QDateTimeParser::SectionNode>::size
                        ((QList<QDateTimeParser::SectionNode> *)&pQVar3->field_0x408);
      in_stack_ffffffffffffff4c.mds = (int)qVar6;
      while (in_stack_ffffffffffffff4c.mds = in_stack_ffffffffffffff4c.mds + -1,
            -1 < in_stack_ffffffffffffff4c.mds) {
        QList<QString>::at((QList<QString> *)in_RDI,(qsizetype)in_stack_fffffffffffffef8);
        QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffef8);
        QDateTimeParser::sectionNode((int)pQVar3 + 0x3d8);
        QDateTimeParser::SectionNode::format();
        QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffef8);
        QString::~QString((QString *)0x55aa1c);
      }
      QList<QString>::at((QList<QString> *)in_RDI,(qsizetype)in_stack_fffffffffffffef8);
      QString::operator+=((QString *)in_RDI,in_stack_fffffffffffffef8);
      in_stack_ffffffffffffff40 = QList<QString>::begin((QList<QString> *)in_RDI);
      QList<QString>::end((QList<QString> *)in_RDI);
      std::reverse<QList<QString>::iterator>
                ((iterator)in_stack_ffffffffffffff18.i,(iterator)in_stack_ffffffffffffff10.i);
      QList<QDateTimeParser::SectionNode>::begin((QList<QDateTimeParser::SectionNode> *)in_RDI);
      iVar5 = QList<QDateTimeParser::SectionNode>::end
                        ((QList<QDateTimeParser::SectionNode> *)in_RDI);
      time_00.mds = (int)((ulong)iVar5.i >> 0x20);
      std::reverse<QList<QDateTimeParser::SectionNode>::iterator>
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    }
    pQVar3->formatExplicitlySet = true;
    local_58 = *(undefined4 *)&pQVar3->field_0x3e8;
    local_54.super_QFlagsStorage<QDateTimeEdit::Section>.i =
         (QFlagsStorage<QDateTimeEdit::Section>)
         QDateTimeEditPrivate::convertSections
                   ((QFlagsStorageHelper<QDateTimeParser::Section,_4>)
                    SUB84(in_stack_ffffffffffffff18.i,0));
    (pQVar3->sections).super_QFlagsStorageHelper<QDateTimeEdit::Section,_4>.
    super_QFlagsStorage<QDateTimeEdit::Section>.i =
         (Int)local_54.super_QFlagsStorage<QDateTimeEdit::Section>.i;
    (**(code **)(*(long *)&(pQVar3->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0xf8))();
    rhs = (QTime *)&pQVar3->field_0x3e0;
    qVar6 = QList<QDateTimeParser::SectionNode>::size
                      ((QList<QDateTimeParser::SectionNode> *)&pQVar3->field_0x408);
    local_60 = qVar6 + -1;
    PVar7 = qMin<int,long_long>(&rhs->mds,&local_60);
    *(int *)&pQVar3->field_0x3e0 = (int)PVar7;
    local_64.super_QFlagsStorage<QDateTimeEdit::Section>.i =
         (QFlagsStorage<QDateTimeEdit::Section>)
         QFlags<QDateTimeEdit::Section>::operator&
                   ((QFlags<QDateTimeEdit::Section> *)in_RDI,(Section)((ulong)rhs >> 0x20));
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_64);
    bVar8 = IVar2 != 0;
    local_68.super_QFlagsStorage<QDateTimeEdit::Section>.i =
         (QFlagsStorage<QDateTimeEdit::Section>)
         QFlags<QDateTimeEdit::Section>::operator&
                   ((QFlags<QDateTimeEdit::Section> *)in_RDI,(Section)((ulong)rhs >> 0x20));
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_68);
    uVar9 = IVar2 != 0;
    if (((bVar8 & 1) == 0) || ((bool)uVar9)) {
      if (((bool)uVar9) && ((bVar8 & 1) == 0)) {
        QTime::QTime(&local_84,0,0,0,0);
        QTime::QTime(&local_88,0x17,0x3b,0x3b,999);
        setTimeRange((QDateTimeEdit *)CONCAT17(bVar8,CONCAT16(uVar9,in_stack_ffffffffffffff20)),
                     in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
        ::QVariant::toDate();
        QDate::startOfDay((QTimeZone *)local_90);
        ::QVariant::QVariant(&local_28,local_90);
        ::QVariant::operator=((QVariant *)this_02,in_RDI);
        ::QVariant::~QVariant(&local_28);
        QDateTime::~QDateTime(local_90);
      }
    }
    else {
      local_6c = 0xaaaaaaaa;
      local_6c = ::QVariant::toTime();
      this_00 = (QDateTimeEdit *)::QVariant::toDate();
      this_01 = (QDateTimeEdit *)::QVariant::toDate();
      min.jd._4_4_ = in_stack_ffffffffffffff4c.mds;
      min.jd._0_4_ = in_stack_ffffffffffffff48.mds;
      setDateRange(this_00,min,(QDate)in_stack_ffffffffffffff40.i);
      local_70 = ::QVariant::toTime();
      local_74 = ::QVariant::toTime();
      bVar1 = operator>=((QTime *)in_RDI,rhs);
      if (bVar1) {
        QTime::QTime(&local_78,0,0,0,0);
        QTime::QTime(&local_7c,0x17,0x3b,0x3b,999);
        setTimeRange((QDateTimeEdit *)CONCAT17(bVar8,CONCAT16(uVar9,in_stack_ffffffffffffff20)),
                     in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
        local_80 = local_6c;
        setTime(this_01,time_00);
      }
    }
    (**(code **)(*(long *)&(pQVar3->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0xc0))();
    (**(code **)(*(long *)&(pQVar3->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0xe8))
              (pQVar3,0xffffffff,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDateTimeEdit::setDisplayFormat(const QString &format)
{
    Q_D(QDateTimeEdit);
    if (d->parseFormat(format)) {
        d->unreversedFormat.clear();
        if (isRightToLeft()) {
            d->unreversedFormat = format;
            d->displayFormat.clear();
            for (int i=d->sectionNodes.size() - 1; i>=0; --i) {
                d->displayFormat += d->separators.at(i + 1);
                d->displayFormat += d->sectionNode(i).format();
            }
            d->displayFormat += d->separators.at(0);
            std::reverse(d->separators.begin(), d->separators.end());
            std::reverse(d->sectionNodes.begin(), d->sectionNodes.end());
        }

        d->formatExplicitlySet = true;
        d->sections = QDateTimeEditPrivate::convertSections(d->display);
        d->clearCache();

        d->currentSectionIndex = qMin(d->currentSectionIndex, d->sectionNodes.size() - 1);
        const bool timeShown = (d->sections & TimeSections_Mask);
        const bool dateShown = (d->sections & DateSections_Mask);
        Q_ASSERT(dateShown || timeShown);
        if (timeShown && !dateShown) {
            QTime time = d->value.toTime();
            setDateRange(d->value.toDate(), d->value.toDate());
            if (d->minimum.toTime() >= d->maximum.toTime()) {
                setTimeRange(QDATETIMEEDIT_TIME_MIN, QDATETIMEEDIT_TIME_MAX);
                // if the time range became invalid during the adjustment, the time would have been reset
                setTime(time);
            }
        } else if (dateShown && !timeShown) {
            setTimeRange(QDATETIMEEDIT_TIME_MIN, QDATETIMEEDIT_TIME_MAX);
            d->value = d->value.toDate().startOfDay(d->timeZone);
        }
        d->updateEdit();
        d->editorCursorPositionChanged(-1, 0);
    }
}